

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

Privkey * __thiscall
cfd::core::Privkey::CreateTweakMul(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *tweak)

{
  ByteData tweak_muled;
  ByteData local_28;
  
  WallyUtil::MulTweakPrivkey(&local_28,&this->data_,tweak);
  Privkey(__return_storage_ptr__,&local_28,kMainnet,true);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakMul(const ByteData256 &tweak) const {
  ByteData tweak_muled = WallyUtil::MulTweakPrivkey(data_, tweak);
  return Privkey(tweak_muled);
}